

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O1

int cmd_cat2(char *args)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  void *__ptr;
  long lVar7;
  void *__ptr_00;
  undefined8 uVar8;
  void *pvVar9;
  long lVar10;
  void *local_60;
  long local_48;
  
  if (*args == '\"') {
    args = args + 1;
    pcVar3 = strchr(args,0x22);
    if (pcVar3 == (char *)0x0) goto LAB_0010462e;
  }
  else {
    pcVar3 = strchr(args,0x20);
  }
  *pcVar3 = '\0';
  if (pcVar3[1] == '\"') {
    pcVar3 = pcVar3 + 2;
    pcVar4 = strchr(pcVar3,0x22);
    if (pcVar4 == (char *)0x0) {
LAB_0010462e:
      puts("missing string terminator in argument.");
      return 1;
    }
    *pcVar4 = '\0';
  }
  else {
    pcVar3 = pcVar3 + 1;
  }
  lVar5 = PHYSFS_openRead(args);
  if (lVar5 == 0) {
    uVar8 = PHYSFS_getLastError();
LAB_00104663:
    lVar6 = 0;
    printf("failed to open \'%s\'. Reason: [%s].\n",args,uVar8);
  }
  else {
    lVar6 = PHYSFS_openRead(pcVar3);
    if (lVar6 == 0) {
      uVar8 = PHYSFS_getLastError();
      args = pcVar3;
      goto LAB_00104663;
    }
    if (do_buffer_size != 0) {
      iVar2 = PHYSFS_setBuffer(lVar5);
      if (iVar2 == 0) {
        uVar8 = PHYSFS_getLastError();
      }
      else {
        iVar2 = PHYSFS_setBuffer(lVar6,do_buffer_size);
        if (iVar2 != 0) goto LAB_001043b5;
        uVar8 = PHYSFS_getLastError();
        args = pcVar3;
      }
      printf("failed to set file buffer for \'%s\'. Reason: [%s].\n",args,uVar8);
      PHYSFS_close(lVar5);
      goto LAB_001046bb;
    }
LAB_001043b5:
    pvVar9 = (void *)0x0;
    lVar10 = 0;
    local_60 = (void *)0x0;
    local_48 = 0;
    do {
      __ptr = realloc(pvVar9,lVar10 + 0x80);
      if (__ptr == (void *)0x0) {
        puts("(Out of memory.)\n");
        free(pvVar9);
        free(local_60);
        PHYSFS_close(lVar5);
        PHYSFS_close(lVar6);
        bVar1 = false;
      }
      else {
        lVar7 = PHYSFS_readBytes(lVar5,(long)__ptr + lVar10,0x80);
        pvVar9 = __ptr;
        if (lVar7 < 0) {
          uVar8 = PHYSFS_getLastError();
          printf("(Error condition in reading \'%s\'. Reason: [%s])\n\n",args,uVar8);
          free(__ptr);
          free(local_60);
          PHYSFS_close(lVar5);
          PHYSFS_close(lVar6);
        }
        else {
          lVar10 = lVar10 + lVar7;
          __ptr_00 = realloc(local_60,local_48 + 0x80);
          if (__ptr_00 != (void *)0x0) {
            lVar7 = PHYSFS_readBytes(lVar6,(long)__ptr_00 + local_48,0x80);
            if (lVar7 < 0) {
              uVar8 = PHYSFS_getLastError();
              printf("(Error condition in reading \'%s\'. Reason: [%s])\n\n",pcVar3,uVar8);
              free(__ptr);
              free(__ptr_00);
              PHYSFS_close(lVar5);
              PHYSFS_close(lVar6);
            }
            else {
              local_48 = local_48 + lVar7;
            }
            bVar1 = lVar7 >= 0;
            local_60 = __ptr_00;
            goto LAB_00104569;
          }
          puts("(Out of memory.)\n");
          free(__ptr);
          free(local_60);
          PHYSFS_close(lVar5);
          PHYSFS_close(lVar6);
        }
        bVar1 = false;
      }
LAB_00104569:
      if (!bVar1) {
        return 1;
      }
      iVar2 = PHYSFS_eof(lVar5);
    } while ((iVar2 == 0) || (iVar2 = PHYSFS_eof(lVar6), iVar2 == 0));
    printf("file \'%s\' ...\n\n",args);
    if (lVar10 != 0) {
      lVar7 = 0;
      do {
        fputc((int)*(char *)((long)pvVar9 + lVar7),_stdout);
        lVar7 = lVar7 + 1;
      } while (lVar10 != lVar7);
    }
    free(pvVar9);
    printf("\n\nfile \'%s\' ...\n\n",pcVar3);
    if (local_48 != 0) {
      lVar10 = 0;
      do {
        fputc((int)*(char *)((long)local_60 + lVar10),_stdout);
        lVar10 = lVar10 + 1;
      } while (local_48 != lVar10);
    }
    free(local_60);
    puts("\n");
  }
  if (lVar5 != 0) {
    PHYSFS_close();
  }
  if (lVar6 == 0) {
    return 1;
  }
LAB_001046bb:
  PHYSFS_close(lVar6);
  return 1;
}

Assistant:

static int cmd_cat2(char *args)
{
    PHYSFS_File *f1 = NULL;
    PHYSFS_File *f2 = NULL;
    char *fname1;
    char *fname2;
    char *ptr;

    fname1 = args;
    if (*fname1 == '\"')
    {
        fname1++;
        ptr = strchr(fname1, '\"');
        if (ptr == NULL)
        {
            printf("missing string terminator in argument.\n");
            return 1;
        } /* if */
        *(ptr) = '\0';
    } /* if */
    else
    {
        ptr = strchr(fname1, ' ');
        *ptr = '\0';
    } /* else */

    fname2 = ptr + 1;
    if (*fname2 == '\"')
    {
        fname2++;
        ptr = strchr(fname2, '\"');
        if (ptr == NULL)
        {
            printf("missing string terminator in argument.\n");
            return 1;
        } /* if */
        *(ptr) = '\0';
    } /* if */

    if ((f1 = PHYSFS_openRead(fname1)) == NULL)
        printf("failed to open '%s'. Reason: [%s].\n", fname1, PHYSFS_getLastError());
    else if ((f2 = PHYSFS_openRead(fname2)) == NULL)
        printf("failed to open '%s'. Reason: [%s].\n", fname2, PHYSFS_getLastError());
    else
    {
        char *buffer1 = NULL;
        size_t buffer1len = 0;
        char *buffer2 = NULL;
        size_t buffer2len = 0;
        char *ptr = NULL;
        size_t i;

        if (do_buffer_size)
        {
            if (!PHYSFS_setBuffer(f1, do_buffer_size))
            {
                printf("failed to set file buffer for '%s'. Reason: [%s].\n",
                        fname1, PHYSFS_getLastError());
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */
            else if (!PHYSFS_setBuffer(f2, do_buffer_size))
            {
                printf("failed to set file buffer for '%s'. Reason: [%s].\n",
                        fname2, PHYSFS_getLastError());
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */
        } /* if */


        do
        {
            int readlen = 128;
            PHYSFS_sint64 rc;

            ptr = realloc(buffer1, buffer1len + readlen);
            if (!ptr)
            {
                printf("(Out of memory.)\n\n");
                free(buffer1);
                free(buffer2);
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */

            buffer1 = ptr;
            rc = PHYSFS_readBytes(f1, buffer1 + buffer1len, readlen);
            if (rc < 0)
            {
                printf("(Error condition in reading '%s'. Reason: [%s])\n\n",
                       fname1, PHYSFS_getLastError());
                free(buffer1);
                free(buffer2);
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */
            buffer1len += (size_t) rc;

            ptr = realloc(buffer2, buffer2len + readlen);
            if (!ptr)
            {
                printf("(Out of memory.)\n\n");
                free(buffer1);
                free(buffer2);
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */

            buffer2 = ptr;
            rc = PHYSFS_readBytes(f2, buffer2 + buffer2len, readlen);
            if (rc < 0)
            {
                printf("(Error condition in reading '%s'. Reason: [%s])\n\n",
                       fname2, PHYSFS_getLastError());
                free(buffer1);
                free(buffer2);
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */
            buffer2len += (size_t) rc;
        } while (!PHYSFS_eof(f1) || !PHYSFS_eof(f2));

        printf("file '%s' ...\n\n", fname1);
        for (i = 0; i < buffer1len; i++)
            fputc((int) buffer1[i], stdout);
        free(buffer1);

        printf("\n\nfile '%s' ...\n\n", fname2);
        for (i = 0; i < buffer2len; i++)
            fputc((int) buffer2[i], stdout);
        free(buffer2);

        printf("\n\n");
    } /* else */

    if (f1)
        PHYSFS_close(f1);

    if (f2)
        PHYSFS_close(f2);

    return 1;
}